

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::convert(Validity *__return_storage_ptr__,CompilerMain *this)

{
  Format format;
  bool bVar1;
  Maybe<kj::String> *pMVar2;
  Validity *pVVar3;
  size_t sVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<const_unsigned_char> local_f8;
  ArrayPtr<const_unsigned_char> local_e0;
  undefined1 local_d0 [8];
  Validity result_2;
  FdOutputStream output;
  undefined1 local_90 [8];
  BufferedInputStreamWrapper input;
  FdInputStream rawInput;
  CompilerMain *this_local;
  Validity *result;
  
  verifyRequirements(__return_storage_ptr__,this,this->convertFrom);
  pMVar2 = kj::MainBuilder::Validity::getError(__return_storage_ptr__);
  bVar1 = kj::Maybe<kj::String>::operator==(pMVar2);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return __return_storage_ptr__;
  }
  kj::MainBuilder::Validity::~Validity(__return_storage_ptr__);
  verifyRequirements(__return_storage_ptr__,this,this->convertTo);
  pMVar2 = kj::MainBuilder::Validity::getError(__return_storage_ptr__);
  bVar1 = kj::Maybe<kj::String>::operator==(pMVar2);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return __return_storage_ptr__;
  }
  kj::MainBuilder::Validity::~Validity(__return_storage_ptr__);
  kj::FdInputStream::FdInputStream((FdInputStream *)&input.bufferAvailable.size_,0);
  kj::ArrayPtr<unsigned_char>::ArrayPtr((ArrayPtr<unsigned_char> *)&output.fd,(void *)0x0);
  kj::BufferedInputStreamWrapper::BufferedInputStreamWrapper
            ((BufferedInputStreamWrapper *)local_90,(InputStream *)&input.bufferAvailable.size_,
             stack0xffffffffffffff60);
  kj::FdOutputStream::FdOutputStream
            ((FdOutputStream *)&result_2.errorMessage.ptr.field_1.value.content.disposer,1);
  if ((this->quiet & 1U) == 0) {
    format = this->convertFrom;
    local_e0 = kj::BufferedInputStream::getReadBuffer((BufferedInputStream *)local_90);
    checkPlausibility((Validity *)local_d0,this,format,local_e0);
    pMVar2 = kj::MainBuilder::Validity::getError((Validity *)local_d0);
    bVar1 = kj::Maybe<kj::String>::operator==(pMVar2);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      pVVar3 = kj::mv<kj::MainBuilder::Validity>((Validity *)local_d0);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,pVVar3);
    }
    kj::MainBuilder::Validity::~Validity((Validity *)local_d0);
    if (bVar1) goto LAB_0013b45c;
  }
  while( true ) {
    AVar5 = kj::BufferedInputStreamWrapper::tryGetReadBuffer((BufferedInputStreamWrapper *)local_90)
    ;
    local_f8 = AVar5;
    sVar4 = kj::ArrayPtr<const_unsigned_char>::size(&local_f8);
    if (sVar4 == 0) break;
    readOneAndConvert(this,(BufferedInputStreamWrapper *)local_90,
                      (OutputStream *)&result_2.errorMessage.ptr.field_1.value.content.disposer);
  }
  (*this->context->_vptr_ProcessContext[1])();
LAB_0013b45c:
  kj::FdOutputStream::~FdOutputStream
            ((FdOutputStream *)&result_2.errorMessage.ptr.field_1.value.content.disposer);
  kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper
            ((BufferedInputStreamWrapper *)local_90);
  kj::FdInputStream::~FdInputStream((FdInputStream *)&input.bufferAvailable.size_);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity convert() {
    {
      auto result = verifyRequirements(convertFrom);
      if (result.getError() != kj::none) return result;
    }
    {
      auto result = verifyRequirements(convertTo);
      if (result.getError() != kj::none) return result;
    }

    kj::FdInputStream rawInput(STDIN_FILENO);
    kj::BufferedInputStreamWrapper input(rawInput);

    kj::FdOutputStream output(STDOUT_FILENO);

    if (!quiet) {
      auto result = checkPlausibility(convertFrom, input.getReadBuffer());
      if (result.getError() != kj::none) {
        return kj::mv(result);
      }
    }

    while (input.tryGetReadBuffer().size() > 0) {
      readOneAndConvert(input, output);
    }

    context.exit();
    KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT;
  }